

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader::data__vcount
          (LibraryControllersLoader *this,unsigned_long_long *data,size_t length)

{
  UIntValuesArray *this_00;
  ulong in_RDX;
  long in_RSI;
  ArrayPrimitiveType<unsigned_int> *in_RDI;
  unsigned_long_long vcount;
  size_t i;
  size_t count;
  UIntValuesArray *jointsPerVertex;
  uint *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ArrayPrimitiveType<unsigned_int> *in_stack_ffffffffffffffc0;
  long lVar1;
  ulong local_38;
  
  if (in_RDI[8].mCount != 0) {
    this_00 = COLLADAFW::SkinControllerData::getJointsPerVertex
                        ((SkinControllerData *)in_RDI[8].mCount);
    COLLADAFW::ArrayPrimitiveType<unsigned_int>::getCount(this_00);
    COLLADAFW::ArrayPrimitiveType<unsigned_int>::reallocMemory
              (in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    for (local_38 = 0; local_38 < in_RDX; local_38 = local_38 + 1) {
      lVar1 = *(long *)(in_RSI + local_38 * 8);
      COLLADAFW::ArrayPrimitiveType<unsigned_int>::append(in_RDI,in_stack_ffffffffffffffa8);
      in_RDI[0xc].mCount = lVar1 + in_RDI[0xc].mCount;
    }
  }
  return true;
}

Assistant:

bool LibraryControllersLoader::data__vcount( const unsigned long long* data, size_t length )
	{
		if ( !mCurrentSkinControllerData )
			return true;
		COLLADAFW::UIntValuesArray& jointsPerVertex = mCurrentSkinControllerData->getJointsPerVertex();
		size_t count = jointsPerVertex.getCount();
		jointsPerVertex.reallocMemory( count + length);
		for ( size_t i = 0; i < length; ++i)
		{
			unsigned long long vcount = data[i];
			jointsPerVertex.append((unsigned int)vcount);
			mCurrentJointsVertexPairCount += (size_t)vcount;
		}
		return true;
	}